

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O0

bool __thiscall Node::is_canonical(Node *this)

{
  char cVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong in_RDI;
  char r;
  char f;
  size_t j;
  size_t i;
  char local_22;
  ulong local_20;
  ulong local_18;
  undefined1 in_stack_fffffffffffffffb;
  LogLevels in_stack_fffffffffffffffc;
  
  local_18 = 0;
  local_20 = std::__cxx11::string::size();
  while( true ) {
    local_20 = local_20 - 1;
    if (local_20 <= local_18) {
      return true;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI);
    cVar1 = *pcVar2;
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI);
    local_22 = *pcVar2;
    switch(local_22) {
    case 'A':
      local_22 = 'T';
      break;
    default:
      poVar3 = sdglib::OutputLog(in_stack_fffffffffffffffc,(bool)in_stack_fffffffffffffffb);
      poVar3 = std::operator<<(poVar3,"Unexpected character in fasta file: \'");
      poVar3 = std::operator<<(poVar3,local_22);
      poVar3 = std::operator<<(poVar3,"\'");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      break;
    case 'C':
      local_22 = 'G';
      break;
    case 'G':
      local_22 = 'C';
      break;
    case 'N':
      break;
    case 'T':
      local_22 = 'A';
    }
    if (cVar1 < local_22) break;
    if (local_22 < cVar1) {
      return false;
    }
    local_18 = local_18 + 1;
  }
  return true;
}

Assistant:

bool Node::is_canonical() {
    for (size_t i=0,j=sequence.size()-1;i<j;++i,--j){
        char f=sequence[i];
        char r=sequence[j];
        switch(r){
            case 'A':
                r='T';
                break;
            case 'C':
                r='G';
                break;
            case 'G':
                r='C';
                break;
            case 'T':
                r='A';
                break;
            case 'N':
                break;
            default:
                sdglib::OutputLog(sdglib::LogLevels::WARN) << "Unexpected character in fasta file: '" << r << "'" << std::endl;
        }
        if (f<r) return true;
        if (r<f) return false;
    }
    return true;
}